

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
SignedBytesEqualFailure::SignedBytesEqualFailure
          (SignedBytesEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          char expected,char actual,SimpleString *text)

{
  SimpleString *in_RCX;
  SimpleString *in_RDX;
  TestFailure *in_RSI;
  SimpleString *in_RDI;
  undefined4 in_R8D;
  SimpleString expectedReported;
  SimpleString actualReported;
  SimpleString eDecimal;
  SimpleString aDecimal;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined7 in_stack_ffffffffffffff08;
  char in_stack_ffffffffffffff0f;
  size_t in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  char in_stack_ffffffffffffff27;
  TestFailure *in_stack_ffffffffffffff28;
  TestFailure *in_stack_ffffffffffffff30;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffff30,(UtestShell *)in_stack_ffffffffffffff28,
             (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  in_RDI->buffer_ = (char *)&PTR__SignedBytesEqualFailure_001c4bf8;
  TestFailure::createUserText
            (in_stack_ffffffffffffff28,
             (SimpleString *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  SimpleString::operator=
            ((SimpleString *)CONCAT44(in_R8D,in_stack_fffffffffffffee0),
             (SimpleString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  SimpleString::~SimpleString((SimpleString *)0x17b848);
  StringFrom(in_stack_fffffffffffffedc);
  StringFrom(in_stack_fffffffffffffedc);
  SimpleString::padStringsToSameLength
            ((SimpleString *)in_stack_ffffffffffffff30,(SimpleString *)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff27);
  SimpleString::SimpleString
            ((SimpleString *)CONCAT44(in_R8D,in_stack_fffffffffffffee0),
             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  SimpleString::operator+
            ((SimpleString *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),in_RDI);
  BracketsFormattedHexStringFrom(in_stack_ffffffffffffff0f);
  SimpleString::operator+
            ((SimpleString *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17b90a);
  SimpleString::~SimpleString((SimpleString *)0x17b917);
  SimpleString::~SimpleString((SimpleString *)0x17b924);
  SimpleString::SimpleString
            ((SimpleString *)CONCAT44(in_R8D,in_stack_fffffffffffffee0),
             (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  SimpleString::operator+
            ((SimpleString *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),in_RDI);
  BracketsFormattedHexStringFrom(in_stack_ffffffffffffff0f);
  SimpleString::operator+
            ((SimpleString *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17b984);
  SimpleString::~SimpleString((SimpleString *)0x17b98e);
  SimpleString::~SimpleString((SimpleString *)0x17b998);
  TestFailure::createButWasString(in_RSI,in_RDX,in_RCX);
  SimpleString::operator+=
            ((SimpleString *)CONCAT44(in_R8D,in_stack_fffffffffffffee0),
             (SimpleString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  SimpleString::~SimpleString((SimpleString *)0x17b9d5);
  SimpleString::~SimpleString((SimpleString *)0x17b9df);
  SimpleString::~SimpleString((SimpleString *)0x17b9ec);
  SimpleString::~SimpleString((SimpleString *)0x17b9f9);
  SimpleString::~SimpleString((SimpleString *)0x17ba06);
  return;
}

Assistant:

SignedBytesEqualFailure::SignedBytesEqualFailure (UtestShell* test, const char* fileName, size_t lineNumber, signed char expected, signed char actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom((int)actual);
    SimpleString eDecimal = StringFrom((int)expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');

    SimpleString actualReported = aDecimal + " " + BracketsFormattedHexStringFrom(actual);
    SimpleString expectedReported = eDecimal + " " + BracketsFormattedHexStringFrom(expected);
    message_ += createButWasString(expectedReported, actualReported);
}